

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_file.c
# Opt level: O2

void test_end(fitsfile *infits,FILE *out)

{
  int iVar1;
  int status;
  LONGLONG dataend;
  int hdutype;
  LONGLONG datastart;
  LONGLONG headstart;
  
  status = 0;
  ffmrhd(infits,1,&hdutype,&status);
  if (status == 0x6b) {
    status = 0;
    ffcmsg();
    iVar1 = ffghadll(infits,&headstart,&datastart,&dataend,&status);
    if (iVar1 != 0) {
      wrtferr(out,"",&status,1);
    }
    iVar1 = ffmbyt(infits,dataend + -1,0,&status);
    if (iVar1 != 0) {
      sprintf(errmes,"Error trying to read last byte of the file at byte %ld.");
      wrterr(out,errmes,2);
      wrtout(out,"< End-of-File >");
      goto LAB_001087b5;
    }
    ffmbyt(infits,dataend,0,&status);
    if (status != 0) {
      return;
    }
    wrtout(out,"< End-of-File >");
    sprintf(errmes,"File has extra byte(s) after last HDU at byte %ld.",dataend);
  }
  else {
    if (status != 0) {
      wrtserr(out,"Bad HDU? ",&status,2);
      return;
    }
    wrtout(out,"< End-of-File >");
    builtin_strncpy(errmes + 0x30,"st HDU.",8);
    builtin_strncpy(errmes,"There are extraneous HDU(s) beyond the end of la",0x30);
  }
  wrterr(out,errmes,2);
LAB_001087b5:
  wrtout(out," ");
  return;
}

Assistant:

void  test_end(fitsfile *infits, 
		  FILE *out) 

{   
   int status = 0; 
   LONGLONG headstart, datastart, dataend;
   int hdutype;

   /* check whether there are any HDU left */ 
   fits_movrel_hdu(infits,1, &hdutype, &status);
   if (!status) {
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
    "There are extraneous HDU(s) beyond the end of last HDU.");
       wrterr(out,errmes,2);
       wrtout(out," ");
       return;
   }

   if (status != END_OF_FILE) { 
      wrtserr(out,"Bad HDU? ",&status,2);
      return;
   } 

   status = 0;  
   fits_clear_errmsg();
   if(ffghadll(infits, &headstart, &datastart, &dataend, &status)) 
       wrtferr(out, "",&status,1);

   /* try to move to the last byte of this extension.  */
   if (ffmbyt(infits, dataend - 1,0,&status))
   {
       sprintf(errmes, 
   "Error trying to read last byte of the file at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out,"< End-of-File >");
       wrtout(out," ");
       return;
   } 

   /* try to move to what would be the first byte of the next extension. 
     If successfull, we have a problem... */

   ffmbyt(infits, dataend,0,&status);
   if(status == 0) { 
       wrtout(out,"< End-of-File >");
       sprintf(errmes, 
     "File has extra byte(s) after last HDU at byte %ld.", (long) dataend);
       wrterr(out,errmes,2);
       wrtout(out," ");
   } 

   return;
}